

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall
llvm::DWARFVerifier::verifyUnitSection
          (DWARFVerifier *this,DWARFSection *S,DWARFSectionKind SectionKind)

{
  SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
  *pSVar1;
  DWARFObject *pDVar2;
  DWARFContext *pDVar3;
  DWARFDataExtractor DebugInfoData_00;
  StringRef SS;
  StringRef SS_00;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  DWARFContext *pDVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  tuple<llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_> tVar12;
  DWARFUnit *Unit;
  DWARFDebugAbbrev *pDVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  raw_ostream *this_00;
  undefined8 uVar14;
  long lVar15;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  undefined1 in_R8B;
  bool *isUnitDWARF64_00;
  StringRef Str;
  undefined1 local_1c8 [8];
  DWARFUnitHeader Header;
  DWARFUnitVector CompileUnitVector;
  DWARFUnitVector TypeUnitVector;
  undefined1 auStack_e0 [8];
  DWARFDataExtractor DebugInfoData;
  uint64_t OffsetStart;
  uint64_t Offset;
  size_t sStack_a0;
  long local_98;
  DWARFObject *local_90;
  DWARFSection *local_88;
  DWARFSectionKind local_7c;
  DWARFSection *local_78;
  DWARFContext *local_70;
  DWARFDebugAbbrev *local_68;
  DWARFSection *local_60;
  DWARFVerifier *local_58;
  ulong local_50;
  __uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> local_48;
  __uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> local_40;
  undefined4 local_38;
  byte local_32;
  bool local_31 [7];
  uint8_t UnitType;
  bool isUnitDWARF64;
  
  pDVar2 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  local_7c = SectionKind;
  iVar6 = (*pDVar2->_vptr_DWARFObject[5])(pDVar2);
  auStack_e0 = (undefined1  [8])(S->Data).Data;
  DebugInfoData.super_DataExtractor.Data.Data = (char *)(S->Data).Length;
  DebugInfoData.super_DataExtractor.Data.Length._0_1_ = (undefined1)iVar6;
  CompileUnitVector._56_8_ =
       &TypeUnitVector.
        super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
        .
        super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
        .
        super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
        .
        super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
        .super_SmallVectorBase.Size;
  TypeUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>.
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.BeginX = (void *)0x100000000;
  TypeUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
  .InlineElts[0].buffer =
       (AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
         [1])(AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              )0x0;
  TypeUnitVector.Parser.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  TypeUnitVector.Parser.super__Function_base._M_functor._8_8_ = 0;
  TypeUnitVector.Parser.super__Function_base._M_manager = (_Manager_type)0x0;
  TypeUnitVector.Parser._M_invoker._0_4_ = 0xffffffff;
  Header._72_8_ =
       &CompileUnitVector.
        super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
        .
        super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
        .
        super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
        .
        super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
        .super_SmallVectorBase.Size;
  CompileUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>.
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.BeginX = (void *)0x100000000;
  DebugInfoData.super_DataExtractor.Data.Length._1_1_ = 0;
  DebugInfoData.Section = (DWARFSection *)0x0;
  OffsetStart = 0;
  local_32 = 0;
  local_50 = 0;
  local_31[0] = false;
  CompileUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
  .InlineElts[0].buffer =
       (AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
         [1])(AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              )0x0;
  CompileUnitVector.Parser.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  CompileUnitVector.Parser.super__Function_base._M_functor._8_8_ = 0;
  CompileUnitVector.Parser.super__Function_base._M_manager = (_Manager_type)0x0;
  CompileUnitVector.Parser._M_invoker._0_4_ = 0xffffffff;
  DebugInfoData.super_DataExtractor._16_8_ = pDVar2;
  DebugInfoData.Obj = (DWARFObject *)S;
  local_90 = pDVar2;
  local_88 = S;
  if (DebugInfoData.super_DataExtractor.Data.Data != (char *)0x0) {
    local_38 = (undefined4)CONCAT71((int7)((ulong)Header._72_8_ >> 8),1);
    lVar15 = 0;
    local_50 = 0;
    local_58 = this;
    do {
      DebugInfoData_00.super_DataExtractor.AddressSize =
           DebugInfoData.super_DataExtractor.Data.Length._1_1_;
      DebugInfoData_00.super_DataExtractor.IsLittleEndian =
           (undefined1)DebugInfoData.super_DataExtractor.Data.Length;
      DebugInfoData_00.super_DataExtractor._18_6_ =
           DebugInfoData.super_DataExtractor.Data.Length._2_6_;
      isUnitDWARF64_00 = local_31;
      DebugInfoData_00.super_DataExtractor.Data.Length =
           (size_t)DebugInfoData.super_DataExtractor.Data.Data;
      DebugInfoData_00.super_DataExtractor.Data.Data = (char *)auStack_e0;
      DebugInfoData_00.Obj = (DWARFObject *)DebugInfoData.super_DataExtractor._16_8_;
      DebugInfoData_00.Section = (DWARFSection *)DebugInfoData.Obj;
      DebugInfoData.Section = (DWARFSection *)OffsetStart;
      local_98 = lVar15;
      bVar4 = verifyUnitHeader(this,DebugInfoData_00,&OffsetStart,(uint)lVar15,&local_32,
                               isUnitDWARF64_00);
      in_R8B = SUB81(isUnitDWARF64_00,0);
      if (bVar4) {
        local_1c8 = (undefined1  [8])0x0;
        Header.DWOId.Storage.field_0.empty = '\0';
        Header.DWOId.Storage.hasVal = false;
        Header.DWOId.Storage._9_1_ = 0;
        Header.TypeHash._0_1_ = 0;
        Header._41_8_ = 0;
        Header.AbbrOffset = 0;
        Header.IndexEntry._0_1_ = 0;
        Header.IndexEntry._1_7_ = 0;
        Header.FormParams.Version = 0;
        Header.FormParams.AddrSize = '\0';
        Header.FormParams.Format = DWARF32;
        Header._12_4_ = 0;
        Header.Length = 0;
        DWARFUnitHeader::extract
                  ((DWARFUnitHeader *)local_1c8,this->DCtx,(DWARFDataExtractor *)auStack_e0,
                   (uint64_t *)&DebugInfoData.Section,local_7c,(DWARFUnitIndex *)0x0,(Entry *)0x0);
        if (6 < local_32) {
          llvm_unreachable_internal
                    ("Invalid UnitType.",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                     ,0x141);
        }
        if ((0x3bU >> (local_32 & 0x1f) & 1) == 0) {
          pDVar3 = this->DCtx;
          pDVar13 = DWARFContext::getDebugAbbrev(pDVar3);
          pDVar2 = local_90;
          iVar6 = (*local_90->_vptr_DWARFObject[0x12])(local_90);
          iVar7 = (*pDVar2->_vptr_DWARFObject[10])(pDVar2);
          local_78 = (DWARFSection *)CONCAT44(extraout_var_06,iVar7);
          iVar7 = (*pDVar2->_vptr_DWARFObject[0x11])(pDVar2);
          Offset = CONCAT44(extraout_var_07,iVar7);
          sStack_a0 = extraout_RDX_00;
          iVar7 = (*pDVar2->_vptr_DWARFObject[0x19])(pDVar2);
          local_70 = pDVar3;
          local_68 = pDVar13;
          local_60 = (DWARFSection *)CONCAT44(extraout_var_05,iVar6);
          iVar6 = (*pDVar2->_vptr_DWARFObject[0x28])(pDVar2);
          iVar8 = (*pDVar2->_vptr_DWARFObject[0xf])(pDVar2);
          iVar9 = (*((local_58->DCtx->DObj)._M_t.
                     super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                     .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                    _vptr_DWARFObject[5])();
          tVar12.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
          super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               operator_new(0x200);
          SS_00.Length = sStack_a0;
          SS_00.Data = (char *)Offset;
          pDVar13 = local_68;
          DWARFUnit::DWARFUnit
                    ((DWARFUnit *)
                     tVar12.
                     super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                     .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,local_70,local_88
                     ,(DWARFUnitHeader *)local_1c8,local_68,local_60,local_78,SS_00,
                     (DWARFSection *)CONCAT44(extraout_var_08,iVar7),
                     (DWARFSection *)CONCAT44(extraout_var_09,iVar6),
                     (DWARFSection *)CONCAT44(extraout_var_10,iVar8),SUB41(iVar9,0),false,
                     (DWARFUnitVector *)&CompileUnitVector.NumInfoUnits);
          in_R8B = SUB81(pDVar13,0);
          *(undefined ***)
           tVar12.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
           super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl = &PTR__DWARFUnit_01078ae0;
          local_48._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
          super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               (tuple<llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               (tuple<llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               tVar12.
               super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
               super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
          Unit = DWARFUnitVector::addUnit
                           ((DWARFUnitVector *)&CompileUnitVector.NumInfoUnits,
                            (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                            &local_48);
          if ((_Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
              local_48._M_t.
              super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
              super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl != (DWARFUnit *)0x0) {
            (**(code **)(*(long *)local_48._M_t.
                                  super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                                  .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl + 8)
            )();
          }
          local_48._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
          super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               (tuple<llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               (_Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)0x0;
        }
        else {
          pDVar3 = this->DCtx;
          pDVar11 = (DWARFContext *)DWARFContext::getDebugAbbrev(pDVar3);
          pDVar2 = local_90;
          iVar6 = (*local_90->_vptr_DWARFObject[0x12])(local_90);
          iVar7 = (*pDVar2->_vptr_DWARFObject[10])(pDVar2);
          iVar8 = (*pDVar2->_vptr_DWARFObject[0x11])(pDVar2);
          Offset = CONCAT44(extraout_var_01,iVar8);
          sStack_a0 = extraout_RDX;
          iVar8 = (*pDVar2->_vptr_DWARFObject[0x19])(pDVar2);
          local_78 = (DWARFSection *)CONCAT44(extraout_var_02,iVar8);
          local_70 = pDVar11;
          local_68 = (DWARFDebugAbbrev *)CONCAT44(extraout_var,iVar6);
          local_60 = (DWARFSection *)CONCAT44(extraout_var_00,iVar7);
          TypeUnitVector.NumInfoUnits = (*pDVar2->_vptr_DWARFObject[0x28])(pDVar2);
          TypeUnitVector._60_4_ = extraout_var_03;
          iVar6 = (*pDVar2->_vptr_DWARFObject[0xf])(pDVar2);
          iVar7 = (*((local_58->DCtx->DObj)._M_t.
                     super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                     .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                    _vptr_DWARFObject[5])();
          tVar12.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
          super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               operator_new(0x200);
          SS.Length = sStack_a0;
          SS.Data = (char *)Offset;
          pDVar11 = local_70;
          DWARFUnit::DWARFUnit
                    ((DWARFUnit *)
                     tVar12.
                     super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                     .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,pDVar3,local_88,
                     (DWARFUnitHeader *)local_1c8,(DWARFDebugAbbrev *)local_70,
                     (DWARFSection *)local_68,local_60,SS,local_78,
                     (DWARFSection *)TypeUnitVector._56_8_,
                     (DWARFSection *)CONCAT44(extraout_var_04,iVar6),SUB41(iVar7,0),false,
                     (DWARFUnitVector *)&Header.UnitType);
          in_R8B = SUB81(pDVar11,0);
          *(undefined ***)
           tVar12.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
           super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               &PTR__DWARFCompileUnit_010780a8;
          local_40._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
          super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               (tuple<llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               (tuple<llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               tVar12.
               super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
               super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
          Unit = DWARFUnitVector::addUnit
                           ((DWARFUnitVector *)&Header.UnitType,
                            (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
                            &local_40);
          if ((_Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
              local_40._M_t.
              super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
              super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl != (DWARFUnit *)0x0) {
            (**(code **)(*(long *)local_40._M_t.
                                  super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                                  .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl + 8)
            )();
          }
          local_40._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
          super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               (tuple<llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               (_Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)0x0;
        }
        uVar10 = verifyUnitContents(local_58,Unit);
        local_50 = (ulong)((int)local_50 + uVar10);
        this = local_58;
      }
      else {
        local_38 = 0;
        if (local_31[0] != false) goto LAB_00d7fb81;
      }
      lVar15 = local_98 + 1;
    } while (OffsetStart < DebugInfoData.super_DataExtractor.Data.Data);
    if (lVar15 != 0) goto LAB_00d7fb81;
  }
  uVar14 = 0;
  this_00 = WithColor::warning((WithColor *)this->OS,(raw_ostream *)0xe67796,(StringRef)ZEXT816(0),
                               (bool)in_R8B);
  local_38 = (undefined4)CONCAT71((int7)((ulong)uVar14 >> 8),1);
  Str.Length = 0x12;
  Str.Data = "Section is empty.\n";
  raw_ostream::operator<<(this_00,Str);
LAB_00d7fb81:
  uVar10 = verifyDebugInfoReferences(this);
  if (CompileUnitVector.Parser.super__Function_base._M_functor._8_8_ != 0) {
    pSVar1 = &CompileUnitVector.
              super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              .
              super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
    ;
    (*(code *)CompileUnitVector.Parser.super__Function_base._M_functor._8_8_)(pSVar1,pSVar1,3);
  }
  SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>::
  ~SmallVector((SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                *)&Header.UnitType);
  if (TypeUnitVector.Parser.super__Function_base._M_functor._8_8_ != 0) {
    pSVar1 = &TypeUnitVector.
              super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              .
              super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
    ;
    (*(code *)TypeUnitVector.Parser.super__Function_base._M_functor._8_8_)(pSVar1,pSVar1,3);
  }
  bVar5 = (byte)local_38;
  iVar6 = uVar10 + (int)local_50;
  SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>::
  ~SmallVector((SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                *)&CompileUnitVector.NumInfoUnits);
  return iVar6 + (uint)(~bVar5 & 1);
}

Assistant:

unsigned DWARFVerifier::verifyUnitSection(const DWARFSection &S,
                                          DWARFSectionKind SectionKind) {
  const DWARFObject &DObj = DCtx.getDWARFObj();
  DWARFDataExtractor DebugInfoData(DObj, S, DCtx.isLittleEndian(), 0);
  unsigned NumDebugInfoErrors = 0;
  uint64_t OffsetStart = 0, Offset = 0, UnitIdx = 0;
  uint8_t UnitType = 0;
  bool isUnitDWARF64 = false;
  bool isHeaderChainValid = true;
  bool hasDIE = DebugInfoData.isValidOffset(Offset);
  DWARFUnitVector TypeUnitVector;
  DWARFUnitVector CompileUnitVector;
  while (hasDIE) {
    OffsetStart = Offset;
    if (!verifyUnitHeader(DebugInfoData, &Offset, UnitIdx, UnitType,
                          isUnitDWARF64)) {
      isHeaderChainValid = false;
      if (isUnitDWARF64)
        break;
    } else {
      DWARFUnitHeader Header;
      Header.extract(DCtx, DebugInfoData, &OffsetStart, SectionKind);
      DWARFUnit *Unit;
      switch (UnitType) {
      case dwarf::DW_UT_type:
      case dwarf::DW_UT_split_type: {
        Unit = TypeUnitVector.addUnit(std::make_unique<DWARFTypeUnit>(
            DCtx, S, Header, DCtx.getDebugAbbrev(), &DObj.getRangesSection(),
            &DObj.getLocSection(), DObj.getStrSection(),
            DObj.getStrOffsetsSection(), &DObj.getAppleObjCSection(),
            DObj.getLineSection(), DCtx.isLittleEndian(), false,
            TypeUnitVector));
        break;
      }
      case dwarf::DW_UT_skeleton:
      case dwarf::DW_UT_split_compile:
      case dwarf::DW_UT_compile:
      case dwarf::DW_UT_partial:
      // UnitType = 0 means that we are verifying a compile unit in DWARF v4.
      case 0: {
        Unit = CompileUnitVector.addUnit(std::make_unique<DWARFCompileUnit>(
            DCtx, S, Header, DCtx.getDebugAbbrev(), &DObj.getRangesSection(),
            &DObj.getLocSection(), DObj.getStrSection(),
            DObj.getStrOffsetsSection(), &DObj.getAppleObjCSection(),
            DObj.getLineSection(), DCtx.isLittleEndian(), false,
            CompileUnitVector));
        break;
      }
      default: { llvm_unreachable("Invalid UnitType."); }
      }
      NumDebugInfoErrors += verifyUnitContents(*Unit);
    }
    hasDIE = DebugInfoData.isValidOffset(Offset);
    ++UnitIdx;
  }
  if (UnitIdx == 0 && !hasDIE) {
    warn() << "Section is empty.\n";
    isHeaderChainValid = true;
  }
  if (!isHeaderChainValid)
    ++NumDebugInfoErrors;
  NumDebugInfoErrors += verifyDebugInfoReferences();
  return NumDebugInfoErrors;
}